

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::
strTree<char_const(&)[62],kj::StringPtr,char_const(&)[92],kj::StringTree,char_const(&)[131],int,char_const(&)[152],kj::Array<kj::StringTree>,char_const(&)[61],kj::Array<kj::StringTree>,char_const(&)[49],kj::Array<kj::StringTree>,char_const(&)[2],kj::Array<kj::StringTree>,kj::String&,char_const(&)[2],kj::Array<kj::StringTree>,kj::String&,char_const(&)[2],kj::Array<kj::StringTree>,kj::Array<kj::StringTree>,char_const(&)[20]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [62],StringPtr *params_1,
          char (*params_2) [92],StringTree *params_3,char (*params_4) [131],int *params_5,
          char (*params_6) [152],Array<kj::StringTree> *params_7,char (*params_8) [61],
          Array<kj::StringTree> *params_9,char (*params_10) [49],Array<kj::StringTree> *params_11,
          char (*params_12) [2],Array<kj::StringTree> *params_13,String *params_14,
          char (*params_15) [2],Array<kj::StringTree> *params_16,String *params_17,
          char (*params_18) [2],Array<kj::StringTree> *params_19,Array<kj::StringTree> *params_20,
          char (*params_21) [20])

{
  Branch *pBVar1;
  StringTree *pSVar2;
  char *pcVar3;
  size_t sVar4;
  StringPtr delim;
  StringPtr delim_00;
  StringPtr delim_01;
  StringPtr delim_02;
  StringPtr delim_03;
  StringPtr delim_04;
  StringPtr delim_05;
  ArrayPtr<const_char> *params_21_00;
  ArrayPtr<const_char> local_2a0;
  undefined1 local_290 [24];
  ArrayDisposer *local_278;
  undefined1 local_270 [24];
  ArrayDisposer *local_258;
  undefined1 local_250 [24];
  ArrayDisposer *local_238;
  undefined1 local_230 [16];
  undefined1 local_220 [24];
  ArrayDisposer *local_208;
  ArrayPtr<const_char> local_200;
  undefined1 local_1f0 [16];
  StringTree local_1e0;
  StringTree local_1a8;
  StringTree local_170;
  StringTree local_138;
  StringTree local_100;
  StringTree local_c8;
  StringTree local_90;
  CappedArray<char,_14UL> local_58;
  Array<kj::StringTree> *local_40;
  char *local_38;
  
  local_1f0._8_8_ = strlen((char *)this);
  local_200.ptr = *(char **)*params;
  local_200.size_ = *(long *)(*params + 8) - 1;
  local_1f0._0_8_ = this;
  local_208 = (ArrayDisposer *)strlen((char *)params_1);
  local_220._16_8_ = params_1;
  local_220._8_8_ = strlen((char *)params_3);
  local_220._0_8_ = params_3;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(int *)*params_4);
  local_230._8_8_ = strlen((char *)params_5);
  local_230._0_8_ = params_5;
  delim.content.size_ = 1;
  delim.content.ptr = "";
  StringTree::StringTree(&local_100,(Array<kj::StringTree> *)params_6,delim);
  local_238 = (ArrayDisposer *)strlen((char *)params_7);
  local_250._16_8_ = params_7;
  delim_00.content.size_ = 1;
  delim_00.content.ptr = "";
  StringTree::StringTree(&local_138,(Array<kj::StringTree> *)params_8,delim_00);
  local_250._8_8_ = strlen((char *)params_9);
  local_250._0_8_ = params_9;
  delim_01.content.size_ = 1;
  delim_01.content.ptr = "";
  StringTree::StringTree(&local_170,(Array<kj::StringTree> *)params_10,delim_01);
  local_258 = (ArrayDisposer *)strlen((char *)params_11);
  local_270._16_8_ = params_11;
  delim_02.content.size_ = 1;
  delim_02.content.ptr = "";
  StringTree::StringTree(&local_1a8,(Array<kj::StringTree> *)params_12,delim_02);
  pBVar1 = (Branch *)params_13->size_;
  local_270._0_8_ = pBVar1;
  if (pBVar1 != (Branch *)0x0) {
    local_270._0_8_ = params_13->ptr;
  }
  local_270._8_8_ = (char *)0x0;
  if (pBVar1 != (Branch *)0x0) {
    local_270._8_8_ = (char *)((long)&pBVar1[-1].content.branches.disposer + 7);
  }
  local_278 = (ArrayDisposer *)strlen((char *)params_14);
  local_290._16_8_ = params_14;
  delim_03.content.size_ = 1;
  delim_03.content.ptr = "";
  StringTree::StringTree
            ((StringTree *)(local_1f0 + 0x10),(Array<kj::StringTree> *)params_15,delim_03);
  pSVar2 = (StringTree *)params_16->size_;
  local_290._0_8_ = pSVar2;
  if (pSVar2 != (StringTree *)0x0) {
    local_290._0_8_ = params_16->ptr;
  }
  local_290._8_8_ = (char *)0x0;
  if (pSVar2 != (StringTree *)0x0) {
    local_290._8_8_ = (char *)((long)&pSVar2[-1].branches.disposer + 7);
  }
  local_2a0.size_ = strlen((char *)params_17);
  local_2a0.ptr = (char *)params_17;
  delim_04.content.size_ = 1;
  delim_04.content.ptr = "";
  StringTree::StringTree(&local_90,(Array<kj::StringTree> *)params_18,delim_04);
  delim_05.content.size_ = 1;
  delim_05.content.ptr = "";
  StringTree::StringTree(&local_c8,params_19,delim_05);
  params_21_00 = (ArrayPtr<const_char> *)0x136132;
  local_38 = (char *)strlen((char *)params_20);
  local_40 = params_20;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)local_1f0,&local_200,
             (ArrayPtr<const_char> *)(local_220 + 0x10),(ArrayPtr<const_char> *)params_2,
             (StringTree *)local_220,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_14UL> *)local_230,(ArrayPtr<const_char> *)&local_100,
             (StringTree *)(local_250 + 0x10),(ArrayPtr<const_char> *)&local_138,
             (StringTree *)local_250,(ArrayPtr<const_char> *)&local_170,
             (StringTree *)(local_270 + 0x10),(ArrayPtr<const_char> *)&local_1a8,
             (StringTree *)local_270,(ArrayPtr<const_char> *)(local_290 + 0x10),
             (ArrayPtr<const_char> *)(local_1f0 + 0x10),(StringTree *)local_290,&local_2a0,
             (ArrayPtr<const_char> *)&local_90,&local_c8,(StringTree *)&local_40,params_21_00);
  sVar4 = local_c8.branches.size_;
  pBVar1 = local_c8.branches.ptr;
  if (local_c8.branches.ptr != (Branch *)0x0) {
    local_c8.branches.ptr = (Branch *)0x0;
    local_c8.branches.size_ = 0;
    (**(local_c8.branches.disposer)->_vptr_ArrayDisposer)
              (local_c8.branches.disposer,pBVar1,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar4 = local_c8.text.content.size_;
  pcVar3 = local_c8.text.content.ptr;
  if (local_c8.text.content.ptr != (char *)0x0) {
    local_c8.text.content.ptr = (char *)0x0;
    local_c8.text.content.size_ = 0;
    (**(local_c8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  sVar4 = local_90.branches.size_;
  pBVar1 = local_90.branches.ptr;
  if (local_90.branches.ptr != (Branch *)0x0) {
    local_90.branches.ptr = (Branch *)0x0;
    local_90.branches.size_ = 0;
    (**(local_90.branches.disposer)->_vptr_ArrayDisposer)
              (local_90.branches.disposer,pBVar1,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar4 = local_90.text.content.size_;
  pcVar3 = local_90.text.content.ptr;
  if (local_90.text.content.ptr != (char *)0x0) {
    local_90.text.content.ptr = (char *)0x0;
    local_90.text.content.size_ = 0;
    (**(local_90.text.content.disposer)->_vptr_ArrayDisposer)
              (local_90.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  sVar4 = local_1e0.branches.size_;
  pBVar1 = local_1e0.branches.ptr;
  if (local_1e0.branches.ptr != (Branch *)0x0) {
    local_1e0.branches.ptr = (Branch *)0x0;
    local_1e0.branches.size_ = 0;
    (*(code *)*(local_1e0.branches.disposer)->_vptr_ArrayDisposer)
              (local_1e0.branches.disposer,pBVar1,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar4 = local_1e0.text.content.size_;
  pcVar3 = local_1e0.text.content.ptr;
  if ((ArrayDisposer *)local_1e0.text.content.ptr != (ArrayDisposer *)0x0) {
    local_1e0.text.content.ptr = (char *)0x0;
    local_1e0.text.content.size_ = 0;
    (*(code *)*(local_1e0.text.content.disposer)->_vptr_ArrayDisposer)
              (local_1e0.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  sVar4 = local_1a8.branches.size_;
  pBVar1 = local_1a8.branches.ptr;
  if (local_1a8.branches.ptr != (Branch *)0x0) {
    local_1a8.branches.ptr = (Branch *)0x0;
    local_1a8.branches.size_ = 0;
    (**(local_1a8.branches.disposer)->_vptr_ArrayDisposer)
              (local_1a8.branches.disposer,pBVar1,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar4 = local_1a8.text.content.size_;
  pcVar3 = local_1a8.text.content.ptr;
  if (local_1a8.text.content.ptr != (char *)0x0) {
    local_1a8.text.content.ptr = (char *)0x0;
    local_1a8.text.content.size_ = 0;
    (**(local_1a8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_1a8.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  sVar4 = local_170.branches.size_;
  pBVar1 = local_170.branches.ptr;
  if (local_170.branches.ptr != (Branch *)0x0) {
    local_170.branches.ptr = (Branch *)0x0;
    local_170.branches.size_ = 0;
    (**(local_170.branches.disposer)->_vptr_ArrayDisposer)
              (local_170.branches.disposer,pBVar1,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar4 = local_170.text.content.size_;
  pcVar3 = local_170.text.content.ptr;
  if (local_170.text.content.ptr != (char *)0x0) {
    local_170.text.content.ptr = (char *)0x0;
    local_170.text.content.size_ = 0;
    (**(local_170.text.content.disposer)->_vptr_ArrayDisposer)
              (local_170.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  sVar4 = local_138.branches.size_;
  pBVar1 = local_138.branches.ptr;
  if (local_138.branches.ptr != (Branch *)0x0) {
    local_138.branches.ptr = (Branch *)0x0;
    local_138.branches.size_ = 0;
    (**(local_138.branches.disposer)->_vptr_ArrayDisposer)
              (local_138.branches.disposer,pBVar1,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar4 = local_138.text.content.size_;
  pcVar3 = local_138.text.content.ptr;
  if (local_138.text.content.ptr != (char *)0x0) {
    local_138.text.content.ptr = (char *)0x0;
    local_138.text.content.size_ = 0;
    (**(local_138.text.content.disposer)->_vptr_ArrayDisposer)
              (local_138.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  sVar4 = local_100.branches.size_;
  pBVar1 = local_100.branches.ptr;
  if (local_100.branches.ptr != (Branch *)0x0) {
    local_100.branches.ptr = (Branch *)0x0;
    local_100.branches.size_ = 0;
    (**(local_100.branches.disposer)->_vptr_ArrayDisposer)
              (local_100.branches.disposer,pBVar1,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar4 = local_100.text.content.size_;
  pcVar3 = local_100.text.content.ptr;
  if (local_100.text.content.ptr != (char *)0x0) {
    local_100.text.content.ptr = (char *)0x0;
    local_100.text.content.size_ = 0;
    (**(local_100.text.content.disposer)->_vptr_ArrayDisposer)
              (local_100.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}